

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O1

void Create_LispWindow(DspInterface dsp)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  unsigned_long uVar4;
  int iVar5;
  Window WVar6;
  GC p_Var7;
  Pixmap PVar8;
  unsigned_long *puVar9;
  uint uVar10;
  ulong uVar11;
  Display *pDVar12;
  int iVar13;
  long lVar14;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  unsigned_long uStack_3a0;
  unsigned_long uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_340;
  undefined8 uStack_338;
  undefined4 auStack_330 [8];
  Window WStack_310;
  undefined8 uStack_308;
  uint uStack_300;
  uint uStack_2fc;
  undefined8 uStack_280;
  XSizeHints *pXStack_278;
  DspInterface pDStack_270;
  XClassHint *pXStack_268;
  code *pcStack_260;
  ulong local_258;
  uint local_250;
  uint local_24c;
  ulong local_248;
  ulong local_240;
  char *IT;
  char *WT;
  XClassHint xclasshint;
  XColor backgroundColor_xcsd;
  XColor foregroundColor_xcsd;
  XSetWindowAttributes Lisp_SetWinAttributes;
  XTextProperty WindowNameText;
  XTextProperty IconText;
  XWMHints Lisp_WMhints;
  XSizeHints szhint;
  XGCValues gcv;
  
  szhint.base_width = 0;
  szhint.base_height = 0;
  szhint.win_gravity = 0;
  szhint._76_4_ = 0;
  szhint.min_aspect.x = 0;
  szhint.min_aspect.y = 0;
  szhint.max_aspect.x = 0;
  szhint.max_aspect.y = 0;
  szhint.max_width = 0;
  szhint.max_height = 0;
  szhint.width_inc = 0;
  szhint.height_inc = 0;
  szhint.width = 0;
  szhint.height = 0;
  szhint.min_width = 0;
  szhint.min_height = 0;
  szhint.flags = 0;
  szhint.x = 0;
  szhint.y = 0;
  Lisp_WMhints.icon_x = 0;
  Lisp_WMhints.icon_y = 0;
  Lisp_WMhints.icon_mask = 0;
  Lisp_WMhints.icon_pixmap = 0;
  Lisp_WMhints.icon_window = 0;
  Lisp_WMhints.flags = 0;
  Lisp_WMhints.input = 0;
  Lisp_WMhints.initial_state = 0;
  Lisp_WMhints.window_group = 0;
  xclasshint.res_name = (char *)0x0;
  xclasshint.res_class = (char *)0x0;
  IconText.format = 0;
  IconText._20_4_ = 0;
  IconText.nitems = 0;
  IconText.value = (uchar *)0x0;
  IconText.encoding = 0;
  WindowNameText.format = 0;
  WindowNameText._20_4_ = 0;
  WindowNameText.nitems = 0;
  WindowNameText.value = (uchar *)0x0;
  WindowNameText.encoding = 0;
  Lisp_SetWinAttributes.colormap = 0;
  Lisp_SetWinAttributes.cursor = 0;
  Lisp_SetWinAttributes.do_not_propagate_mask = 0;
  Lisp_SetWinAttributes.override_redirect = 0;
  Lisp_SetWinAttributes._92_4_ = 0;
  Lisp_SetWinAttributes.save_under = 0;
  Lisp_SetWinAttributes._68_4_ = 0;
  Lisp_SetWinAttributes.event_mask = 0;
  Lisp_SetWinAttributes.backing_planes = 0;
  Lisp_SetWinAttributes.backing_pixel = 0;
  Lisp_SetWinAttributes.bit_gravity = 0;
  Lisp_SetWinAttributes.win_gravity = 0;
  Lisp_SetWinAttributes.backing_store = 0;
  Lisp_SetWinAttributes._44_4_ = 0;
  Lisp_SetWinAttributes.border_pixmap = 0;
  Lisp_SetWinAttributes.border_pixel = 0;
  Lisp_SetWinAttributes.background_pixmap = 0;
  Lisp_SetWinAttributes.background_pixel = 0;
  WT = windowTitle;
  IT = iconTitle;
  uVar11 = (ulong)dsp->ScrollBarWidth;
  uVar1 = dsp->InternalBorderWidth;
  local_24c = (dsp->Visible).width;
  uVar10 = (dsp->Visible).height;
  pDVar12 = dsp->display_id;
  lVar3 = *(long *)(pDVar12 + 0xe8);
  lVar14 = (long)*(int *)(pDVar12 + 0xe0) * 0x80;
  foregroundPixel = *(unsigned_long *)(lVar3 + 0x60 + lVar14);
  backgroundPixel = *(unsigned_long *)(lVar3 + 0x58 + lVar14);
  if (foregroundColorName[0] != '\0') {
    pcStack_260 = (code *)0x14071f;
    iVar5 = XAllocNamedColor(pDVar12,Colors,foregroundColorName,&foregroundColor_xcsd,
                             &foregroundColor_xcsd);
    iVar13 = (int)pDVar12;
    if (iVar5 == 0) {
      pcStack_260 = (code *)0x1411e2;
      Create_LispWindow_cold_1();
      goto LAB_001411e2;
    }
    foregroundPixel = foregroundColor_xcsd.pixel;
  }
  local_250 = uVar1;
  local_240 = uVar11;
  if (backgroundColorName[0] != '\0') {
    pDVar12 = dsp->display_id;
    pcStack_260 = (code *)0x14076e;
    iVar5 = XAllocNamedColor(pDVar12,Colors,backgroundColorName,&backgroundColor_xcsd,
                             &backgroundColor_xcsd);
    iVar13 = (int)pDVar12;
    if (iVar5 == 0) {
LAB_001411e2:
      pcStack_260 = lisp_Xvideocolor;
      Create_LispWindow_cold_2();
      pDStack_270 = dsp;
      pXStack_268 = (XClassHint *)uVar11;
      pcStack_260 = (code *)lVar14;
      memset(auStack_330,0,0xc0);
      uStack_340 = 0;
      uStack_338 = 0;
      uStack_350 = 0;
      uStack_348 = 0;
      uStack_360 = 0;
      uStack_358 = 0;
      uStack_370 = 0;
      uStack_368 = 0;
      uStack_380 = 0;
      uStack_378 = 0;
      uStack_390 = 0;
      uStack_388 = 0;
      uStack_3a0 = 0;
      uStack_398 = 0;
      uStack_3b0 = 0;
      uStack_3a8 = 0;
      puVar9 = &foregroundPixel;
      if (iVar13 != 0) {
        puVar9 = &backgroundPixel;
      }
      uVar4 = *puVar9;
      XGetGCValues(currentdsp->display_id,currentdsp->Copy_GC,0xc,&uStack_3b0);
      if (uVar4 != uStack_3a0) {
        uStack_398 = uStack_3a0;
        uStack_3a0 = uVar4;
        XChangeGC(currentdsp->display_id,currentdsp->Copy_GC,0xc);
        auStack_330[0] = 0xc;
        WStack_310 = currentdsp->DisplayWindow;
        uStack_308 = 0;
        uStack_300 = (currentdsp->Visible).width;
        uStack_2fc = (currentdsp->Visible).height;
        XSendEvent(currentdsp->display_id,WStack_310,1,0);
      }
      XFlush(currentdsp->display_id);
      return;
    }
    backgroundPixel = backgroundColor_xcsd.pixel;
  }
  uVar11 = lVar3 + lVar14;
  iVar5 = dsp->InternalBorderWidth * 2 + dsp->ScrollBarWidth;
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)foregroundPixel;
  pXStack_278 = (XSizeHints *)0x0;
  uStack_280 = 0x1407e7;
  local_258 = uVar11;
  local_248 = (ulong)uVar10;
  WVar6 = XCreateSimpleWindow(dsp->display_id,*(undefined8 *)(uVar11 + 0x10),LispWindowRequestedX,
                              LispWindowRequestedY,(dsp->Visible).width + iVar5,
                              iVar5 + (dsp->Visible).height);
  dsp->LispWindow = WVar6;
  Lisp_SetWinAttributes.bit_gravity = dsp->BitGravity;
  Lisp_SetWinAttributes._88_8_ = Lisp_SetWinAttributes._88_8_ & 0xffffffff00000000;
  Lisp_SetWinAttributes.backing_store = *(int *)(uVar11 + 0x70);
  pcStack_260 = (code *)0x140821;
  XChangeWindowAttributes(dsp->display_id,WVar6,0x210,&Lisp_SetWinAttributes);
  dsp->DisableEventMask = 0;
  dsp->EnableEventMask = 0x2807f;
  pcStack_260 = (code *)0x140873;
  p_Var7 = (GC)XCreateGC(dsp->display_id,dsp->LispWindow,0xd);
  dsp->Copy_GC = p_Var7;
  szhint.min_height = dsp->InternalBorderWidth * 2 + dsp->ScrollBarWidth;
  szhint.max_height = (dsp->Display).height + szhint.min_height;
  szhint.max_width = (dsp->Display).width + szhint.min_height;
  szhint.min_width = szhint.min_height;
  szhint.win_gravity = dsp->BitGravity;
  szhint.flags = 0x228;
  pcStack_260 = (code *)0x1408c5;
  Lisp_WMhints.icon_pixmap = make_Xicon(dsp);
  Lisp_WMhints.input = 1;
  Lisp_WMhints.flags = 5;
  xclasshint.res_name = *save_argv;
  xclasshint.res_class = *save_argv;
  pcStack_260 = (code *)0x140916;
  XStringListToTextProperty(&WT,1,&WindowNameText);
  pcStack_260 = (code *)0x140930;
  XStringListToTextProperty(&IT,1,&IconText);
  uStack_280 = 0x140966;
  pXStack_278 = &szhint;
  pDStack_270 = (DspInterface)&Lisp_WMhints;
  pXStack_268 = &xclasshint;
  XSetWMProperties(dsp->display_id,dsp->LispWindow,&WindowNameText,&IconText,save_argv,save_argc);
  pcStack_260 = (code *)0x140984;
  XSelectInput(dsp->display_id,dsp->LispWindow,dsp->EnableEventMask);
  pcStack_260 = (code *)0x14098c;
  init_Xcursor(dsp);
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)foregroundPixel;
  pXStack_278 = (XSizeHints *)0x0;
  uStack_280 = 0x1409c6;
  WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,0,0,(dsp->Visible).width,
                              (dsp->Visible).height);
  dsp->DisplayWindow = WVar6;
  pcStack_260 = (code *)0x1409ea;
  XChangeWindowAttributes(dsp->display_id,WVar6,0x250,&Lisp_SetWinAttributes);
  pcStack_260 = (code *)0x140a04;
  XSelectInput(dsp->display_id,dsp->DisplayWindow,dsp->EnableEventMask);
  pcStack_260 = (code *)0x140a17;
  XMapWindow(dsp->display_id,dsp->DisplayWindow);
  uVar11 = local_258;
  pcStack_260 = (code *)(ulong)*(uint *)(local_258 + 0x38);
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)0x140a56;
  PVar8 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,check_bits,0x10,0x10,foregroundPixel);
  dsp->ScrollBarPixmap = PVar8;
  pcStack_260 = (code *)(ulong)*(uint *)(uVar11 + 0x38);
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)0x140a95;
  PVar8 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,check_bits,0x10,0x10,foregroundPixel);
  dsp->GravityOnPixmap = PVar8;
  pcStack_260 = (code *)(ulong)*(uint *)(uVar11 + 0x38);
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)0x140ad8;
  PVar8 = XCreatePixmapFromBitmapData(dsp->display_id,dsp->LispWindow,plain_bits,0x10,0x10);
  dsp->GravityOffPixmap = PVar8;
  pcStack_260 = (code *)0x140b00;
  set_Xcursor(dsp,defaultcursor_bitmap,0,0,&DefaultCursor,0);
  pcStack_260 = (code *)0x140b23;
  set_Xcursor(dsp,waitcursor_bitmap,7,7,&WaitCursor,0);
  pcStack_260 = (code *)0x140b43;
  set_Xcursor(dsp,scrolldowncursor_bitmap,7,0,&ScrollDownCursor,0);
  pcStack_260 = (code *)0x140b66;
  set_Xcursor(dsp,"",8,10,&ScrollLeftCursor,0);
  pcStack_260 = (code *)0x140b86;
  set_Xcursor(dsp,"\x01",7,0,&VertScrollCursor,0);
  pcStack_260 = (code *)0x140ba9;
  set_Xcursor(dsp,"",8,7,&VertThumbCursor,0);
  pcStack_260 = (code *)0x140bcc;
  set_Xcursor(dsp,"",7,10,&HorizScrollCursor,0);
  pcStack_260 = (code *)0x140bef;
  set_Xcursor(dsp,"",6,7,&HorizThumbCursor,0);
  pcStack_260 = (code *)0x140c12;
  set_Xcursor(dsp,"",7,10,&ScrollRightCursor,0);
  pcStack_260 = (code *)0x140c32;
  set_Xcursor(dsp,"\x01",7,0,&ScrollUpCursor,0);
  uVar11 = local_248;
  uVar1 = local_24c;
  if (noscroll == 0) {
    uVar10 = (uint)(local_240 >> 1) & 0x7fffffff;
    iVar13 = uVar10 - local_250;
    uVar10 = uVar10 + local_250 & 0x7fffffff;
    local_258 = CONCAT44(local_258._4_4_,(int)local_248 + uVar10);
    iVar5 = uVar10 + local_24c;
    pXStack_278 = (XSizeHints *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140caf;
    WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,local_24c,-dsp->InternalBorderWidth,
                                dsp->ScrollBarWidth,(dsp->Visible).height);
    dsp->VerScrollBar = WVar6;
    pcStack_260 = (code *)0x140cd0;
    XDefineCursor(dsp->display_id,WVar6,VertScrollCursor);
    pcStack_260 = (code *)0x140ce3;
    XMapWindow(dsp->display_id,dsp->VerScrollBar);
    pXStack_278 = (XSizeHints *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140d22;
    WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,-dsp->InternalBorderWidth,
                                uVar11 & 0xffffffff,(dsp->Visible).width,dsp->ScrollBarWidth);
    dsp->HorScrollBar = WVar6;
    pcStack_260 = (code *)0x140d43;
    XDefineCursor(dsp->display_id,WVar6,HorizScrollCursor);
    pcStack_260 = (code *)0x140d60;
    XChangeWindowAttributes(dsp->display_id,dsp->HorScrollBar,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x140d73;
    XMapWindow(dsp->display_id,dsp->HorScrollBar);
    pXStack_278 = (XSizeHints *)(ulong)dsp->InternalBorderWidth;
    uVar10 = (dsp->Visible).height;
    uVar2 = (dsp->Display).height;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140ddf;
    WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->VerScrollBar,-dsp->InternalBorderWidth,
                                (long)(int)((dsp->Visible).y * uVar10) / (long)(int)uVar2 &
                                0xffffffff,dsp->ScrollBarWidth,(uVar10 * uVar10) / uVar2 + 1);
    dsp->VerScrollButton = WVar6;
    pcStack_260 = (code *)0x140e06;
    XChangeWindowAttributes(dsp->display_id,WVar6,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x140e20;
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->VerScrollButton,dsp->ScrollBarPixmap);
    pcStack_260 = (code *)0x140e33;
    XClearWindow(dsp->display_id,dsp->VerScrollButton);
    pcStack_260 = (code *)0x140e46;
    XMapWindow(dsp->display_id,dsp->VerScrollButton);
    uVar10 = (dsp->Visible).width;
    uVar2 = (dsp->Display).width;
    pXStack_278 = (XSizeHints *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140eb0;
    WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->HorScrollBar,
                                (long)(int)((dsp->Visible).x * uVar10) / (long)(int)uVar2 &
                                0xffffffff,-dsp->InternalBorderWidth,(uVar10 * uVar10) / uVar2 + 1,
                                dsp->ScrollBarWidth);
    dsp->HorScrollButton = WVar6;
    pcStack_260 = (code *)0x140ed2;
    XChangeWindowAttributes(dsp->display_id,WVar6,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x140eec;
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->HorScrollButton,dsp->ScrollBarPixmap);
    pcStack_260 = (code *)0x140eff;
    XClearWindow(dsp->display_id,dsp->HorScrollButton);
    pcStack_260 = (code *)0x140f12;
    XMapWindow(dsp->display_id,dsp->HorScrollButton);
    pXStack_278 = (XSizeHints *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140f48;
    WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,uVar1,uVar11 & 0xffffffff,iVar13,
                                iVar13);
    dsp->NWGrav = WVar6;
    pcStack_260 = (code *)0x140f69;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar6,dsp->GravityOnPixmap);
    pcStack_260 = (code *)0x140f83;
    XDefineCursor(dsp->display_id,dsp->NWGrav,DefaultCursor);
    pcStack_260 = (code *)0x140fa1;
    XChangeWindowAttributes(dsp->display_id,dsp->NWGrav,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x140fb4;
    XClearWindow(dsp->display_id,dsp->NWGrav);
    pcStack_260 = (code *)0x140fc7;
    XMapWindow(dsp->display_id,dsp->NWGrav);
    uVar11 = local_258;
    pXStack_278 = (XSizeHints *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x141001;
    WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,iVar5,local_258 & 0xffffffff,iVar13,
                                iVar13);
    dsp->SEGrav = WVar6;
    pcStack_260 = (code *)0x141022;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar6,dsp->GravityOffPixmap);
    pcStack_260 = (code *)0x14103c;
    XDefineCursor(dsp->display_id,dsp->SEGrav,DefaultCursor);
    pcStack_260 = (code *)0x141057;
    XChangeWindowAttributes(dsp->display_id,dsp->SEGrav,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x14106a;
    XClearWindow(dsp->display_id,dsp->NWGrav);
    pcStack_260 = (code *)0x14107d;
    XMapWindow(dsp->display_id,dsp->SEGrav);
    pXStack_278 = (XSizeHints *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x1410b3;
    WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,uVar1,uVar11 & 0xffffffff,iVar13,
                                iVar13);
    dsp->SWGrav = WVar6;
    pcStack_260 = (code *)0x1410d4;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar6,dsp->GravityOffPixmap);
    pcStack_260 = (code *)0x1410ee;
    XDefineCursor(dsp->display_id,dsp->SWGrav,DefaultCursor);
    pcStack_260 = (code *)0x141101;
    XClearWindow(dsp->display_id,dsp->NWGrav);
    pcStack_260 = (code *)0x141114;
    XMapWindow(dsp->display_id,dsp->SWGrav);
    pXStack_278 = (XSizeHints *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x14114b;
    WVar6 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,iVar5,local_248,iVar13,iVar13);
    dsp->NEGrav = WVar6;
    pcStack_260 = (code *)0x14116c;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar6,dsp->GravityOffPixmap);
    pcStack_260 = (code *)0x141186;
    XDefineCursor(dsp->display_id,dsp->NEGrav,DefaultCursor);
    pcStack_260 = (code *)0x141199;
    XClearWindow(dsp->display_id,dsp->NWGrav);
    pcStack_260 = (code *)0x1411ac;
    XMapWindow(dsp->display_id,dsp->NEGrav);
  }
  pcStack_260 = (code *)0x1411bf;
  XMapWindow(dsp->display_id,dsp->LispWindow);
  pcStack_260 = (code *)0x1411cb;
  XFlush(dsp->display_id);
  return;
}

Assistant:

void Create_LispWindow(DspInterface dsp)
{
  extern char foregroundColorName[];
  extern char backgroundColorName[];
  XColor foregroundColor_xcsd;
  XColor backgroundColor_xcsd;
  Status status;
  XSizeHints szhint = {0};
  XWMHints Lisp_WMhints = {0};
  XClassHint xclasshint = {0};
  XTextProperty IconText = {0}, WindowNameText = {0};
  XSetWindowAttributes Lisp_SetWinAttributes = {0};
  XGCValues gcv = {0};

  Screen *screen;

  unsigned int Col2, Row2, Col3, Row3;
  unsigned int GravSize;
  char *WT, *IT;

  WT = windowTitle;
  IT = iconTitle;

  GravSize = (dsp->ScrollBarWidth / 2) - dsp->InternalBorderWidth;
  Col2 = dsp->Visible.width;
  Row2 = dsp->Visible.height;
  Col3 = dsp->Visible.width + (OUTER_SB_WIDTH(dsp) / 2);
  Row3 = dsp->Visible.height + (OUTER_SB_WIDTH(dsp) / 2);

  screen = ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id));
  /* set up default display as black on white */
  foregroundPixel = BlackPixelOfScreen(screen); 
  backgroundPixel = WhitePixelOfScreen(screen);
  /* parse and record non-default color specs for foreground and background */
  if (foregroundColorName[0]) {
    status = XAllocNamedColor(dsp->display_id, Colors, foregroundColorName, &foregroundColor_xcsd, &foregroundColor_xcsd);
    if (status == 0) {
      fprintf(stderr, "Color allocation failed for foreground color: %s\n", foregroundColorName);
      exit(1);
    }
    foregroundPixel = foregroundColor_xcsd.pixel;
  }
  if (backgroundColorName[0]) {
    status = XAllocNamedColor(dsp->display_id, Colors, backgroundColorName, &backgroundColor_xcsd, &backgroundColor_xcsd);
    if (status == 0) {
      fprintf(stderr, "Color allocation failed for background color: %s\n", backgroundColorName);
      exit(1);
    }
    backgroundPixel = backgroundColor_xcsd.pixel;
  }
  dsp->LispWindow = XCreateSimpleWindow(
      dsp->display_id, RootWindowOfScreen(screen), LispWindowRequestedX, /* Default upper left */
      LispWindowRequestedY,                                              /* Default upper left */
      dsp->Visible.width + OUTER_SB_WIDTH(dsp),                         /* Default width */
      dsp->Visible.height + OUTER_SB_WIDTH(dsp),                        /* Default height */
      0,                                                                 /* Default border */
      foregroundPixel, backgroundPixel);

  Lisp_SetWinAttributes.bit_gravity = dsp->BitGravity;
  Lisp_SetWinAttributes.override_redirect = False;
  Lisp_SetWinAttributes.backing_store = DoesBackingStore(screen);

  XChangeWindowAttributes(dsp->display_id, dsp->LispWindow, CWBitGravity | CWOverrideRedirect,
                          &Lisp_SetWinAttributes);

  dsp->DisableEventMask = NoEventMask;
  dsp->EnableEventMask = ButtonPressMask | ButtonReleaseMask | EnterWindowMask | LeaveWindowMask |
                         StructureNotifyMask | PointerMotionMask | ExposureMask | KeyPressMask |
                         KeyReleaseMask;

  /* Have to make the GC before we make the icon. */
  gcv.function = GXcopy;
  gcv.foreground = foregroundPixel;
  gcv.background = backgroundPixel;
  dsp->Copy_GC =
      XCreateGC(dsp->display_id, dsp->LispWindow, GCForeground | GCBackground | GCFunction, &gcv);

  szhint.max_width = (int)(dsp->Display.width + OUTER_SB_WIDTH(dsp));
  szhint.max_height = (int)(dsp->Display.height + OUTER_SB_WIDTH(dsp));
  szhint.min_width = (int)OUTER_SB_WIDTH(dsp);
  szhint.min_height = (int)OUTER_SB_WIDTH(dsp);
  szhint.win_gravity = dsp->BitGravity;
  szhint.flags = PMaxSize | PWinGravity | PSize;

  Lisp_WMhints.icon_pixmap = make_Xicon(dsp);
  Lisp_WMhints.input = True;
  Lisp_WMhints.flags = IconPixmapHint | InputHint;

  xclasshint.res_name = *save_argv;
  xclasshint.res_class = *save_argv;

  XStringListToTextProperty(&WT, 1, &WindowNameText);
  XStringListToTextProperty(&IT, 1, &IconText);

  XSetWMProperties(dsp->display_id, dsp->LispWindow, &WindowNameText, &IconText, save_argv,
                   save_argc, &szhint, &Lisp_WMhints, &xclasshint);

  XSelectInput(dsp->display_id, dsp->LispWindow, dsp->EnableEventMask);
  init_Xcursor(dsp);

  dsp->DisplayWindow = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, 0, 0,
                                           dsp->Visible.width, dsp->Visible.height, 0,
                                           foregroundPixel, backgroundPixel);
  XChangeWindowAttributes(dsp->display_id, dsp->DisplayWindow,
                          CWBitGravity | CWOverrideRedirect | CWBackingStore,
                          &Lisp_SetWinAttributes);
  XSelectInput(dsp->display_id, dsp->DisplayWindow, dsp->EnableEventMask);
  XMapWindow(dsp->display_id, dsp->DisplayWindow);

  /*********************************************************************/
  /* Create all the vanilla pixmaps and cursors for the display window */
  /*********************************************************************/

  dsp->ScrollBarPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)check_bits, check_width, check_height,
      foregroundPixel, backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));
  dsp->GravityOnPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)check_bits, 16, 16, foregroundPixel,
      backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));

  dsp->GravityOffPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)plain_bits, 16, 16, foregroundPixel,
      backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));

  set_Xcursor(dsp, default_cursor.cuimage, (int)default_cursor.cuhotspotx,
              (int)(15 - default_cursor.cuhotspoty), &DefaultCursor, 0);
  set_Xcursor(dsp, wait_cursor.cuimage, (int)wait_cursor.cuhotspotx,
              (int)(15 - wait_cursor.cuhotspoty), &WaitCursor, 0);
  set_Xcursor(dsp, scrolldown_cursor.cuimage, (int)scrolldown_cursor.cuhotspotx,
              (int)(15 - scrolldown_cursor.cuhotspoty), &ScrollDownCursor, 0);
  set_Xcursor(dsp, scrollleft_cursor.cuimage, (int)scrollleft_cursor.cuhotspotx,
              (int)(15 - scrollleft_cursor.cuhotspoty), &ScrollLeftCursor, 0);
  set_Xcursor(dsp, vertscroll_cursor.cuimage, (int)vertscroll_cursor.cuhotspotx,
              (int)(15 - vertscroll_cursor.cuhotspoty), &VertScrollCursor, 0);
  set_Xcursor(dsp, vertthumb_cursor.cuimage, (int)vertthumb_cursor.cuhotspotx,
              (int)(15 - vertthumb_cursor.cuhotspoty), &VertThumbCursor, 0);
  set_Xcursor(dsp, horizscroll_cursor.cuimage, (int)horizscroll_cursor.cuhotspotx,
              (int)(15 - horizscroll_cursor.cuhotspoty), &HorizScrollCursor, 0);
  set_Xcursor(dsp, horizthumb_cursor.cuimage, (int)horizthumb_cursor.cuhotspotx,
              (int)(15 - horizthumb_cursor.cuhotspoty), &HorizThumbCursor, 0);
  set_Xcursor(dsp, scrollright_cursor.cuimage, (int)scrollright_cursor.cuhotspotx,
              (int)(15 - scrollright_cursor.cuhotspoty), &ScrollRightCursor, 0);
  set_Xcursor(dsp, scrollup_cursor.cuimage, (int)scrollup_cursor.cuhotspotx,
              (int)(15 - scrollup_cursor.cuhotspoty), &ScrollUpCursor, 0);

  if (noscroll == 0) {
    /********************************/
    /* Make all the toolkit windows */
    /********************************/
    dsp->VerScrollBar = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2,
                                            0 - (int)dsp->InternalBorderWidth, /* y */
                                            dsp->ScrollBarWidth,          /* width */
                                            dsp->Visible.height, dsp->InternalBorderWidth,
                                            foregroundPixel, backgroundPixel);
    DefineCursor(dsp, dsp->VerScrollBar, &VertScrollCursor);
    XMapWindow(dsp->display_id, dsp->VerScrollBar);

    dsp->HorScrollBar = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow,
                                            0 - (int)dsp->InternalBorderWidth, (int)Row2, /* y */
                                            dsp->Visible.width,                /* width */
                                            dsp->ScrollBarWidth, dsp->InternalBorderWidth,
                                            foregroundPixel, backgroundPixel);
    DefineCursor(dsp, dsp->HorScrollBar, &HorizScrollCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->HorScrollBar, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XMapWindow(dsp->display_id, dsp->HorScrollBar);

    dsp->VerScrollButton = XCreateSimpleWindow(
                                               dsp->display_id, dsp->VerScrollBar, 0 - (int)dsp->InternalBorderWidth,      /* x */
                                               (dsp->Visible.y * (int)dsp->Visible.height) / (int)dsp->Display.height, /* y */
                                               dsp->ScrollBarWidth,                                                   /* width */
                                               ((dsp->Visible.height * dsp->Visible.height) / dsp->Display.height) + 1,
                                               dsp->InternalBorderWidth, foregroundPixel, backgroundPixel);
    XChangeWindowAttributes(dsp->display_id, dsp->VerScrollButton, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->VerScrollButton, dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id, dsp->VerScrollButton);
    XMapWindow(dsp->display_id, dsp->VerScrollButton);

    dsp->HorScrollButton = XCreateSimpleWindow(
                                               dsp->display_id, dsp->HorScrollBar,
                                               (dsp->Visible.x * (int)dsp->Visible.width) / (int)dsp->Display.width,
                                               0 - (int)dsp->InternalBorderWidth, /* y */
                                               ((dsp->Visible.width * dsp->Visible.width) / dsp->Display.width) + 1,
                                               dsp->ScrollBarWidth, dsp->InternalBorderWidth, foregroundPixel,
                                               backgroundPixel);
    XChangeWindowAttributes(dsp->display_id, dsp->HorScrollButton, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->HorScrollButton, dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id, dsp->HorScrollButton);
    XMapWindow(dsp->display_id, dsp->HorScrollButton);

    dsp->NWGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2, (int)Row2, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->NWGrav, dsp->GravityOnPixmap);
    DefineCursor(dsp, dsp->NWGrav, &DefaultCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->NWGrav, CWOverrideRedirect, &Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->NWGrav);

    dsp->SEGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col3, (int)Row3, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->SEGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->SEGrav, &DefaultCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->SEGrav, CWOverrideRedirect, &Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->SEGrav);

    dsp->SWGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2, (int)Row3, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->SWGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->SWGrav, &DefaultCursor);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->SWGrav);

    dsp->NEGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col3, (int)Row2, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->NEGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->NEGrav, &DefaultCursor);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->NEGrav);
  }
  /* DefineCursor( dsp, dsp->DisplayWindow, &WaitCursor ); */

  XLOCK;
  XMapWindow(dsp->display_id, dsp->LispWindow);
  XFlush(dsp->display_id);
  XUNLOCK(dsp);
}